

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O0

void tls_thread(void *arg)

{
  long lVar1;
  void *pvVar2;
  void *arg_local;
  
  lVar1 = uv_key_get(&tls_key);
  if (lVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread.c"
            ,0xbc,"NULL == uv_key_get(&tls_key)");
    abort();
  }
  uv_key_set(&tls_key,arg);
  pvVar2 = (void *)uv_key_get(&tls_key);
  if (arg != pvVar2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread.c"
            ,0xbe,"arg == uv_key_get(&tls_key)");
    abort();
  }
  uv_key_set(&tls_key,0);
  lVar1 = uv_key_get(&tls_key);
  if (lVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread.c"
            ,0xc0,"NULL == uv_key_get(&tls_key)");
    abort();
  }
  return;
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT(NULL == uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT(arg == uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT(NULL == uv_key_get(&tls_key));
}